

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::Model::AppendBody
          (Model *this,SpatialTransform *joint_frame,Joint *joint,Body *body,string *body_name)

{
  uint uVar1;
  string local_50;
  
  uVar1 = this->previously_added_body_id;
  std::__cxx11::string::string((string *)&local_50,(string *)body_name);
  uVar1 = AddBody(this,uVar1,joint_frame,joint,body,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return uVar1;
}

Assistant:

unsigned int Model::AppendBody (
  const Math::SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  return Model::AddBody (previously_added_body_id,
                         joint_frame,
                         joint,
                         body,
                         body_name);
}